

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O2

int __thiscall
musicBlock::occupyChannel
          (musicBlock *this,uint slot,uint channel,int note,int volume,OP2instrEntry *instrument,
          uchar secondary)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  char cVar7;
  uint uVar8;
  OPL2instrument *instr;
  
  this->channels[slot].channel = (uchar)channel;
  this->channels[slot].note = (uchar)note;
  this->channels[slot].flags = secondary != '\0';
  if (0x27 < (this->driverdata).channelModulation[channel]) {
    this->channels[slot].flags = secondary != '\0' | 4;
  }
  this->channels[slot].time = this->MLtime;
  if (volume == -1) {
    volume = (int)(this->driverdata).channelLastVolume[channel];
  }
  else {
    (this->driverdata).channelLastVolume[channel] = (uchar)volume;
  }
  bVar1 = (this->driverdata).channelVolume[channel];
  bVar2 = (this->driverdata).channelExpression[channel];
  this->channels[slot].volume = volume;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (ulong)(uint)volume * (ulong)bVar1 * (ulong)bVar2;
  uVar5 = SUB164(auVar4 / ZEXT816(0x3f01),0);
  uVar8 = 0x7f;
  if (uVar5 < 0x7f) {
    uVar8 = uVar5;
  }
  this->channels[slot].realvolume = uVar8;
  uVar3 = instrument->flags;
  if ((uVar3 & 1) == 0) {
    if (channel == 0xf) {
      note = 0x3c;
    }
  }
  else {
    note = (int)instrument->note;
  }
  if ((uVar3 & 4) == 0 || secondary == '\0') {
    cVar7 = '\0';
  }
  else {
    cVar7 = (char)(instrument->finetune + 0x180 >> 1);
  }
  this->channels[slot].finetune = cVar7;
  this->channels[slot].pitch = (int)(this->driverdata).channelPitch[channel] + (int)cVar7;
  instr = instrument->instr + (secondary != '\0');
  this->channels[slot].instr = instr;
  uVar8 = note;
  if (channel != 0xf && (uVar3 & 1) == 0) {
    iVar6 = (int)instrument->instr[secondary != '\0'].basenote;
    uVar8 = note + iVar6;
    if ((int)uVar8 < 0) {
      uVar5 = 0xfffffff4;
      if (0xfffffff4 < uVar8) {
        uVar5 = uVar8;
      }
      uVar8 = note + ((uVar5 - (uVar8 + (uVar8 < 0xfffffff4))) / 0xc + (uint)(uVar8 < 0xfffffff4)) *
                     0xc + iVar6 + 0xc;
    }
    else if (0x7f < uVar8) {
      iVar6 = uVar8 - 0x8b;
      if (uVar8 < 0x8b) {
        iVar6 = 0;
      }
      uVar8 = (uVar8 + ((iVar6 + 0xbU) % 0xc - (iVar6 + 0xbU))) - 0xc;
    }
  }
  this->channels[slot].realnote = (uchar)uVar8;
  OPLio::OPLwriteInstrument(this->io,slot,instr);
  if ((this->channels[slot].flags & 4) != 0) {
    writeModulation(this,slot,instr,1);
  }
  OPLio::OPLwritePan(this->io,slot,instr,(int)(this->driverdata).channelPan[channel]);
  OPLio::OPLwriteVolume(this->io,slot,instr,this->channels[slot].realvolume);
  writeFrequency(this,slot,uVar8,this->channels[slot].pitch,1);
  return slot;
}

Assistant:

int musicBlock::occupyChannel(uint slot, uint channel,
						 int note, int volume, struct OP2instrEntry *instrument, uchar secondary)
{
	struct OPL2instrument *instr;
	struct channelEntry *ch = &channels[slot];

	ch->channel = channel;
	ch->note = note;
	ch->flags = secondary ? CH_SECONDARY : 0;
	if (driverdata.channelModulation[channel] >= MOD_MIN)
		ch->flags |= CH_VIBRATO;
	ch->time = MLtime;
	if (volume == -1)
		volume = driverdata.channelLastVolume[channel];
	else
		driverdata.channelLastVolume[channel] = volume;
	ch->realvolume = calcVolume(driverdata.channelVolume[channel],
		driverdata.channelExpression[channel], ch->volume = volume);
	if (instrument->flags & FL_FIXED_PITCH)
		note = instrument->note;
	else if (channel == PERCUSSION)
		note = 60;			// C-5
	if (secondary && (instrument->flags & FL_DOUBLE_VOICE))
		ch->finetune = (instrument->finetune - 0x80) >> 1;
	else
		ch->finetune = 0;
	ch->pitch = ch->finetune + driverdata.channelPitch[channel];
	if (secondary)
		instr = &instrument->instr[1];
	else
		instr = &instrument->instr[0];
	ch->instr = instr;
	if (channel != PERCUSSION && !(instrument->flags & FL_FIXED_PITCH))
	{
		if ( (note += instr->basenote) < 0)
			while ((note += 12) < 0) {}
		else if (note > HIGHEST_NOTE)
			while ((note -= 12) > HIGHEST_NOTE) {}
	}
	ch->realnote = note;

	io->OPLwriteInstrument(slot, instr);
	if (ch->flags & CH_VIBRATO)
		writeModulation(slot, instr, 1);
	io->OPLwritePan(slot, instr, driverdata.channelPan[channel]);
	io->OPLwriteVolume(slot, instr, ch->realvolume);
	writeFrequency(slot, note, ch->pitch, 1);
	return slot;
}